

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keyexpimp.c
# Opt level: O1

int gost_tlstree(int cipher_nid,uchar *in,uchar *out,uchar *tlsseq)

{
  ulong uVar1;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t seed3;
  uint64_t seed2;
  uint64_t seed1;
  uchar ko2 [32];
  uchar ko1 [32];
  
  uVar3 = 0xc0ffffff;
  uVar4 = 0;
  if (cipher_nid == 0x4a6) {
    uVar5 = 0xf0ffffffffffff;
    uVar6 = 0xfeffffffff;
  }
  else {
    if (cipher_nid != 0x3f7) {
      return 0;
    }
    uVar3 = 0xffffffff;
    uVar5 = 0xc0ffffffffffffff;
    uVar6 = 0xf8ffffffffff;
  }
  uVar1 = *(ulong *)tlsseq;
  seed1 = uVar3 & uVar1;
  seed2 = uVar6 & uVar1;
  seed3 = uVar5 & uVar1;
  iVar2 = gost_kdftree2012_256(ko1,0x20,in,0x20,(uchar *)"level1",6,(uchar *)&seed1,8,1);
  if ((0 < iVar2) &&
     (iVar2 = gost_kdftree2012_256(ko2,0x20,ko1,0x20,(uchar *)"level2",6,(uchar *)&seed2,8,1),
     0 < iVar2)) {
    iVar2 = gost_kdftree2012_256(out,0x20,ko2,0x20,(uchar *)"level3",6,(uchar *)&seed3,8,1);
    uVar4 = (uint)(0 < iVar2);
  }
  return uVar4;
}

Assistant:

int gost_tlstree(int cipher_nid, const unsigned char *in, unsigned char *out,
                 const unsigned char *tlsseq)
{
    uint64_t gh_c1 = 0x00000000FFFFFFFF, gh_c2 = 0x0000F8FFFFFFFFFF,
        gh_c3 = 0xC0FFFFFFFFFFFFFF;
    uint64_t mg_c1 = 0x00000000C0FFFFFF, mg_c2 = 0x000000FEFFFFFFFF,
        mg_c3 = 0x00F0FFFFFFFFFFFF;
    uint64_t c1, c2, c3;
    uint64_t seed1, seed2, seed3;
    uint64_t seq;
    unsigned char ko1[32], ko2[32];

    switch (cipher_nid) {
    case NID_magma_cbc:
        c1 = mg_c1;
        c2 = mg_c2;
        c3 = mg_c3;
        break;
    case NID_grasshopper_cbc:
        c1 = gh_c1;
        c2 = gh_c2;
        c3 = gh_c3;
        break;
    default:
        return 0;
    }
#ifndef L_ENDIAN
    BUF_reverse((unsigned char *)&seq, tlsseq, 8);
#else
    memcpy(&seq, tlsseq, 8);
#endif
    seed1 = seq & c1;
    seed2 = seq & c2;
    seed3 = seq & c3;

    if (gost_kdftree2012_256(ko1, 32, in, 32, (const unsigned char *)"level1", 6,
                         (const unsigned char *)&seed1, 8, 1) <= 0
			  || gost_kdftree2012_256(ko2, 32, ko1, 32, (const unsigned char *)"level2", 6,
                         (const unsigned char *)&seed2, 8, 1) <= 0
        || gost_kdftree2012_256(out, 32, ko2, 32, (const unsigned char *)"level3", 6,
                         (const unsigned char *)&seed3, 8, 1) <= 0)
			return 0;

    return 1;
}